

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.c
# Opt level: O3

void XXH128_digest(XXH128_state_t *state_in,void *out)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar1 = state_in->ll[0];
  if (uVar1 < 0x20) {
    uVar2 = state_in->ll[1] + 0x27d4eb2f165667c5;
    uVar3 = state_in->ll[1] + 0x9e3779b185ebca87;
    switch((uint)uVar1 & 0x1f) {
    case 0:
      goto switchD_0014324d_caseD_0;
    case 2:
      goto switchD_0014324d_caseD_2;
    case 3:
      goto switchD_0014324d_caseD_3;
    case 4:
      goto switchD_0014324d_caseD_4;
    case 5:
      goto switchD_0014324d_caseD_5;
    case 6:
      goto switchD_0014324d_caseD_6;
    case 7:
      goto switchD_0014324d_caseD_7;
    case 8:
      goto switchD_0014324d_caseD_8;
    case 9:
      goto switchD_0014324d_caseD_9;
    case 10:
      goto switchD_0014324d_caseD_a;
    case 0xb:
      goto switchD_0014324d_caseD_b;
    case 0xc:
      goto switchD_0014324d_caseD_c;
    case 0xd:
      goto switchD_0014324d_caseD_d;
    case 0xe:
      goto switchD_0014324d_caseD_e;
    case 0xf:
      goto switchD_0014324d_caseD_f;
    case 0x10:
      goto switchD_0014324d_caseD_10;
    case 0x11:
      goto switchD_0014324d_caseD_11;
    case 0x12:
      goto switchD_0014324d_caseD_12;
    case 0x13:
      goto switchD_0014324d_caseD_13;
    case 0x14:
      goto switchD_0014324d_caseD_14;
    case 0x15:
      goto switchD_0014324d_caseD_15;
    case 0x16:
      goto switchD_0014324d_caseD_16;
    case 0x17:
      goto switchD_0014324d_caseD_17;
    case 0x18:
      goto switchD_0014324d_caseD_18;
    case 0x19:
      goto switchD_0014324d_caseD_19;
    case 0x1a:
      goto switchD_0014324d_caseD_1a;
    case 0x1b:
      goto switchD_0014324d_caseD_1b;
    case 0x1c:
      goto switchD_0014324d_caseD_1c;
    case 0x1d:
      goto switchD_0014324d_caseD_1d;
    case 0x1e:
      goto switchD_0014324d_caseD_1e;
    case 0x1f:
      goto switchD_0014324d_caseD_1f;
    }
  }
  else {
    uVar2 = (ulong)(state_in->ll[2] * -0x3d4d51c2d82b14b1) >> 0x21 |
            state_in->ll[2] * -0x6c158a5880000000;
    uVar3 = uVar2 * -0x61c8864e7a143579;
    uVar4 = ((ulong)(state_in->ll[3] * -0x3d4d51c2d82b14b1) >> 0x1f |
            state_in->ll[3] * 0x4fa9d69e00000000) * -0x61c8864e7a143579 ^
            (uVar2 * 0x2a66d805bdebca87 + (uVar3 >> 0x25)) * -0x61c8864e7a143579 +
            0x85ebca77c2b2ae63;
    uVar2 = ((ulong)(state_in->ll[4] * -0x3d4d51c2d82b14b1) >> 0x23 |
            state_in->ll[4] * -0x5b05629620000000) * -0x61c8864e7a143579 ^ uVar3 ^
            ((uVar4 << 0x1b | uVar4 >> 0x25) + uVar4) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63;
    uVar3 = ((ulong)(state_in->ll[5] * -0x3d4d51c2d82b14b1) >> 0x25 |
            state_in->ll[5] * -0x16c158a588000000) * -0x61c8864e7a143579 ^ uVar4 ^
            ((uVar2 << 0x1b | uVar2 >> 0x25) + uVar2) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63;
    uVar2 = ((uVar3 << 0x1b | uVar3 >> 0x25) + uVar3) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63 ^
            uVar2;
    switch((uint)uVar1 & 0x1f) {
    case 0:
      goto switchD_0014324d_caseD_0;
    case 0x1f:
switchD_0014324d_caseD_1f:
      uVar3 = uVar3 ^ (ulong)*(byte *)((long)state_in->ll + 0x4e) << 0x30;
    case 0x1e:
switchD_0014324d_caseD_1e:
      uVar3 = uVar3 ^ (ulong)*(byte *)((long)state_in->ll + 0x4d) << 0x28;
    case 0x1d:
switchD_0014324d_caseD_1d:
      uVar3 = uVar3 ^ (ulong)*(byte *)((long)state_in->ll + 0x4c) << 0x20;
    case 0x1c:
switchD_0014324d_caseD_1c:
      uVar3 = uVar3 ^ (ulong)*(byte *)((long)state_in->ll + 0x4b) << 0x18;
    case 0x1b:
switchD_0014324d_caseD_1b:
      uVar3 = uVar3 ^ (ulong)*(byte *)((long)state_in->ll + 0x4a) << 0x10;
    case 0x1a:
switchD_0014324d_caseD_1a:
      uVar3 = uVar3 ^ (ulong)*(byte *)((long)state_in->ll + 0x49) << 8;
    case 0x19:
switchD_0014324d_caseD_19:
      uVar3 = uVar3 ^ (byte)state_in->ll[9];
      uVar2 = uVar2 ^ (uVar3 * -0x3d4d51c2d82b14b1 >> 0x35 | uVar3 * -0x6a8e16c158a58800) *
                      -0x61c8864e7a143579;
    case 0x18:
switchD_0014324d_caseD_18:
      uVar2 = uVar2 ^ (ulong)*(byte *)((long)state_in->ll + 0x47) << 0x38;
    case 0x17:
switchD_0014324d_caseD_17:
      uVar2 = uVar2 ^ (ulong)*(byte *)((long)state_in->ll + 0x46) << 0x30;
    case 0x16:
switchD_0014324d_caseD_16:
      uVar2 = uVar2 ^ (ulong)*(byte *)((long)state_in->ll + 0x45) << 0x28;
    case 0x15:
switchD_0014324d_caseD_15:
      uVar2 = uVar2 ^ (ulong)*(byte *)((long)state_in->ll + 0x44) << 0x20;
    case 0x14:
switchD_0014324d_caseD_14:
      uVar2 = uVar2 ^ (ulong)*(byte *)((long)state_in->ll + 0x43) << 0x18;
    case 0x13:
switchD_0014324d_caseD_13:
      uVar2 = uVar2 ^ (ulong)*(byte *)((long)state_in->ll + 0x42) << 0x10;
    case 0x12:
switchD_0014324d_caseD_12:
      uVar2 = uVar2 ^ (ulong)*(byte *)((long)state_in->ll + 0x41) << 8;
    case 0x11:
switchD_0014324d_caseD_11:
      uVar2 = uVar2 ^ (byte)state_in->ll[8];
      uVar3 = uVar3 ^ (uVar2 * -0x3d4d51c2d82b14b1 >> 0x35 | uVar2 * -0x6a8e16c158a58800) *
                      -0x61c8864e7a143579;
    case 0x10:
switchD_0014324d_caseD_10:
      uVar3 = uVar3 ^ (ulong)*(byte *)((long)state_in->ll + 0x3f) << 0x38;
    case 0xf:
switchD_0014324d_caseD_f:
      uVar3 = uVar3 ^ (ulong)*(byte *)((long)state_in->ll + 0x3e) << 0x30;
    case 0xe:
switchD_0014324d_caseD_e:
      uVar3 = uVar3 ^ (ulong)*(byte *)((long)state_in->ll + 0x3d) << 0x28;
    case 0xd:
switchD_0014324d_caseD_d:
      uVar3 = uVar3 ^ (ulong)*(byte *)((long)state_in->ll + 0x3c) << 0x20;
    case 0xc:
switchD_0014324d_caseD_c:
      uVar3 = uVar3 ^ (ulong)*(byte *)((long)state_in->ll + 0x3b) << 0x18;
    case 0xb:
switchD_0014324d_caseD_b:
      uVar3 = uVar3 ^ (ulong)*(byte *)((long)state_in->ll + 0x3a) << 0x10;
    case 10:
switchD_0014324d_caseD_a:
      uVar3 = uVar3 ^ (ulong)*(byte *)((long)state_in->ll + 0x39) << 8;
    case 9:
switchD_0014324d_caseD_9:
      uVar3 = uVar3 ^ (byte)state_in->ll[7];
      uVar2 = uVar2 ^ (uVar3 * -0x3d4d51c2d82b14b1 >> 0x35 | uVar3 * -0x6a8e16c158a58800) *
                      -0x61c8864e7a143579;
    case 8:
switchD_0014324d_caseD_8:
      uVar2 = uVar2 ^ (ulong)*(byte *)((long)state_in->ll + 0x37) << 0x38;
    case 7:
switchD_0014324d_caseD_7:
      uVar2 = uVar2 ^ (ulong)*(byte *)((long)state_in->ll + 0x36) << 0x30;
    case 6:
switchD_0014324d_caseD_6:
      uVar2 = uVar2 ^ (ulong)*(byte *)((long)state_in->ll + 0x35) << 0x28;
    case 5:
switchD_0014324d_caseD_5:
      uVar2 = uVar2 ^ (ulong)*(byte *)((long)state_in->ll + 0x34) << 0x20;
    case 4:
switchD_0014324d_caseD_4:
      uVar2 = uVar2 ^ (ulong)*(byte *)((long)state_in->ll + 0x33) << 0x18;
    case 3:
switchD_0014324d_caseD_3:
      uVar2 = uVar2 ^ (ulong)*(byte *)((long)state_in->ll + 0x32) << 0x10;
    case 2:
switchD_0014324d_caseD_2:
      uVar2 = uVar2 ^ (ulong)*(byte *)((long)state_in->ll + 0x31) << 8;
    }
  }
  uVar2 = (byte)state_in->ll[6] ^ uVar2;
  uVar3 = uVar3 ^ (uVar2 * 0x27d4eb2f165667c5 >> 0x35 | uVar2 * -0x58a6874d4cc1d800) *
                  -0x61c8864e7a143579;
switchD_0014324d_caseD_0:
  uVar2 = uVar1 + 0x85ebca77c2b2ae63 + (uVar3 << 0x1b | uVar3 >> 0x25) * -0x61c8864e7a143579;
  uVar3 = (uVar2 >> 0x21 ^ uVar3 + uVar1) * -0x3d4d51c2d82b14b1;
  uVar1 = (uVar3 >> 0x1d ^ uVar2) * 0x165667b19e3779f9;
  *(ulong *)out = uVar1;
  *(ulong *)((long)out + 8) = uVar1 >> 0x20 ^ uVar3;
  return;
}

Assistant:

void XXH128_digest(const XXH128_state_t *state_in, void *out) {
    XXH_endianess endian_detected = (XXH_endianess) XXH_CPU_LITTLE_ENDIAN;

    if ((endian_detected == XXH_littleEndian) || XXH_FORCE_NATIVE_FORMAT)
        return XXH128_digest_endian(state_in, XXH_littleEndian, (unsigned long long *) out);
    else
        return XXH128_digest_endian(state_in, XXH_bigEndian, (unsigned long long *) out);
}